

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::ExtractSubrange
          (RepeatedField<unsigned_long> *this,int start,int num,unsigned_long *elements)

{
  LogMessage *pLVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  LogFinisher local_71;
  unsigned_long *local_70;
  LogMessage local_68;
  
  local_70 = elements;
  if (start < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2d9);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=(&local_71,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (num < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2da);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=(&local_71,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (this->current_size_ < num + start) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2db);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (start + num) <= (this->current_size_): ");
    internal::LogFinisher::operator=(&local_71,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (local_70 != (unsigned_long *)0x0) {
    uVar4 = 0;
    uVar3 = 0;
    if (0 < num) {
      uVar3 = (ulong)(uint)num;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      puVar2 = Get(this,start + (int)uVar4);
      local_70[uVar4] = *puVar2;
    }
  }
  if (0 < num) {
    while( true ) {
      if (this->current_size_ <= num + start) break;
      puVar2 = Get(this,num + start);
      Set(this,start,puVar2);
      start = start + 1;
    }
    Truncate(this,this->current_size_ - num);
  }
  return;
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, this->current_size_);

  // Save the values of the removed elements if requested.
  if (elements != nullptr) {
    for (int i = 0; i < num; ++i) elements[i] = this->Get(i + start);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < this->current_size_; ++i)
      this->Set(i - num, this->Get(i));
    this->Truncate(this->current_size_ - num);
  }
}